

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O3

duckdb_logical_type duckdb_create_enum_type(char **member_names,idx_t member_count)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint uVar3;
  size_t sVar4;
  LogicalType *this;
  undefined8 in_RCX;
  data_ptr_t pdVar5;
  char *__s;
  idx_t iVar6;
  string_t sVar7;
  Vector enum_vector;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  LogicalType local_c8;
  Vector local_b0;
  LogicalType local_48;
  
  if (member_names == (char **)0x0) {
    this = (LogicalType *)0x0;
  }
  else {
    duckdb::LogicalType::LogicalType(&local_c8,VARCHAR);
    duckdb::Vector::Vector(&local_b0,&local_c8,member_count);
    duckdb::LogicalType::~LogicalType(&local_c8);
    if (member_count != 0) {
      pdVar5 = local_b0.data + 8;
      iVar6 = 0;
      do {
        __s = member_names[iVar6];
        if (__s == (char *)0x0) {
          this = (LogicalType *)0x0;
          goto LAB_015e12bf;
        }
        sVar4 = strlen(__s);
        uVar3 = (uint)sVar4;
        if (uVar3 < 0xd) {
          uStack_cc = 0;
          uStack_d4 = 0;
          uStack_d0 = 0;
          if (uVar3 == 0) {
            __s = (char *)0x0;
          }
          else {
            switchD_012bc561::default(&uStack_d4,__s,(ulong)(uVar3 & 0xf));
            __s = (char *)CONCAT44(uStack_cc,uStack_d0);
          }
        }
        else {
          uStack_d4 = *(undefined4 *)__s;
          uStack_d0 = SUB84(__s,0);
          uStack_cc = (undefined4)((ulong)__s >> 0x20);
        }
        sVar7.value.pointer.ptr = (char *)in_RCX;
        sVar7.value._0_8_ = __s;
        sVar7 = duckdb::StringVector::AddStringOrBlob
                          ((StringVector *)&local_b0,(Vector *)CONCAT44(uStack_d4,uVar3),sVar7);
        *(long *)(pdVar5 + -8) = sVar7.value._0_8_;
        *(long *)pdVar5 = sVar7.value._8_8_;
        iVar6 = iVar6 + 1;
        pdVar5 = pdVar5 + 0x10;
      } while (member_count != iVar6);
    }
    this = (LogicalType *)operator_new(0x18);
    duckdb::LogicalType::LogicalType(this);
    duckdb::LogicalType::ENUM(&local_48,&local_b0,member_count);
    this->id_ = local_48.id_;
    this->physical_type_ = local_48.physical_type_;
    peVar1 = (this->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (this->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (this->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_48.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_48.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_48.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    local_48.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2
    ;
    duckdb::LogicalType::~LogicalType(&local_48);
LAB_015e12bf:
    if (local_b0.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_b0.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    duckdb::LogicalType::~LogicalType(&local_b0.type);
  }
  return (duckdb_logical_type)this;
}

Assistant:

duckdb_logical_type duckdb_create_enum_type(const char **member_names, idx_t member_count) {
	if (!member_names) {
		return nullptr;
	}
	duckdb::Vector enum_vector(duckdb::LogicalType::VARCHAR, member_count);
	auto enum_vector_ptr = duckdb::FlatVector::GetData<duckdb::string_t>(enum_vector);

	for (idx_t i = 0; i < member_count; i++) {
		if (!member_names[i]) {
			return nullptr;
		}
		enum_vector_ptr[i] = duckdb::StringVector::AddStringOrBlob(enum_vector, member_names[i]);
	}

	duckdb::LogicalType *mtype = new duckdb::LogicalType;
	*mtype = duckdb::LogicalType::ENUM(enum_vector, member_count);
	return reinterpret_cast<duckdb_logical_type>(mtype);
}